

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

QHash<int,_QDBusCustomTypeInfo> * __thiscall
QHash<int,_QDBusCustomTypeInfo>::operator=
          (QHash<int,_QDBusCustomTypeInfo> *this,QHash<int,_QDBusCustomTypeInfo> *other)

{
  Data *pDVar1;
  bool bVar2;
  long *in_RSI;
  QHash<int,_QDBusCustomTypeInfo> *in_RDI;
  Data<QHashPrivate::Node<int,_QDBusCustomTypeInfo>_> *unaff_retaddr;
  Data *o;
  Data *this_00;
  
  if (in_RDI->d != (Data *)*in_RSI) {
    this_00 = (Data *)*in_RSI;
    if (this_00 != (Data *)0x0) {
      QtPrivate::RefCount::ref((RefCount *)in_RDI);
    }
    if (((in_RDI->d != (Data *)0x0) && (bVar2 = QtPrivate::RefCount::deref(&this_00->ref), !bVar2))
       && (pDVar1 = in_RDI->d, pDVar1 != (Data *)0x0)) {
      QHashPrivate::Data<QHashPrivate::Node<int,_QDBusCustomTypeInfo>_>::~Data(unaff_retaddr);
      operator_delete(pDVar1,0x28);
    }
    in_RDI->d = this_00;
  }
  return in_RDI;
}

Assistant:

QHash &operator=(const QHash &other) noexcept(std::is_nothrow_destructible<Node>::value)
    {
        if (d != other.d) {
            Data *o = other.d;
            if (o)
                o->ref.ref();
            if (d && !d->ref.deref())
                delete d;
            d = o;
        }
        return *this;
    }